

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O0

void __thiscall
EquationCat::genPattern(EquationCat *this,vector<TokenPattern,_std::allocator<TokenPattern>_> *ops)

{
  TokenPattern *this_00;
  TokenPattern *tokpat;
  TokenPattern local_40;
  vector<TokenPattern,_std::allocator<TokenPattern>_> *local_18;
  vector<TokenPattern,_std::allocator<TokenPattern>_> *ops_local;
  EquationCat *this_local;
  
  local_18 = ops;
  ops_local = (vector<TokenPattern,_std::allocator<TokenPattern>_> *)this;
  (*this->left->_vptr_PatternEquation[2])(this->left,ops);
  (*this->right->_vptr_PatternEquation[2])(this->right,local_18);
  this_00 = PatternEquation::getTokenPattern(this->left);
  tokpat = PatternEquation::getTokenPattern(this->right);
  TokenPattern::doCat(&local_40,this_00,tokpat);
  TokenPattern::operator=(&(this->super_PatternEquation).resultpattern,&local_40);
  TokenPattern::~TokenPattern(&local_40);
  return;
}

Assistant:

void EquationCat::genPattern(const vector<TokenPattern> &ops) const

{
  left->genPattern(ops);
  right->genPattern(ops);
  resultpattern = left->getTokenPattern().doCat(right->getTokenPattern());
}